

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void translateBrowsePathToNodeIds
               (UA_Server *server,UA_Session *session,UA_BrowsePath *path,
               UA_BrowsePathResult *result)

{
  UA_NodeStore *ns;
  undefined8 uVar1;
  UA_NodeId *n2;
  UA_Session *pUVar2;
  ulong uVar3;
  UA_Boolean UVar4;
  UA_StatusCode UVar5;
  int iVar6;
  UA_Byte *pUVar7;
  UA_NodeStoreEntry *pUVar8;
  UA_NodeStoreEntry *pUVar9;
  UA_NodeStoreEntry *__ptr;
  UA_NodeStoreEntry **ppUVar10;
  UA_Byte *pUVar11;
  ulong uVar12;
  long *plVar13;
  ulong uVar14;
  UA_BrowsePath *pUVar15;
  long lVar16;
  UA_ReferenceNode *pUVar17;
  size_t sVar18;
  UA_NodeId *pUVar19;
  ulong uVar20;
  ulong uVar21;
  size_t local_c8;
  ulong local_c0;
  UA_Session *local_b8;
  UA_NodeId *local_b0;
  UA_NodeId *reftypes;
  UA_NodeStoreEntry *local_a0;
  UA_Byte *local_98;
  UA_UInt16 *local_90;
  UA_NodeId *local_88;
  size_t local_80;
  anon_union_16_4_621dfe33_for_identifier *local_78;
  UA_BrowsePath *local_70;
  ulong local_68;
  UA_NodeStoreEntry *local_60;
  ulong local_58;
  ulong local_50;
  UA_NodeId *local_48;
  UA_NodeStoreEntry *local_40;
  char local_31;
  
  pUVar7 = (session->clientDescription).productUri.data;
  if (pUVar7 == (UA_Byte *)0x0) {
    *(undefined4 *)&path->startingNode = 0x800f0000;
    return;
  }
  plVar13 = (long *)((session->clientDescription).applicationName.locale.length + 0x28);
  do {
    if (((short)plVar13[-1] == 0) && (*plVar13 == 0)) {
      *(undefined4 *)&path->startingNode = 0x80600000;
      return;
    }
    plVar13 = plVar13 + 7;
    pUVar7 = pUVar7 + -1;
  } while (pUVar7 != (UA_Byte *)0x0);
  reftypes = (UA_NodeId *)server;
  pUVar8 = (UA_NodeStoreEntry *)malloc(0x230);
  (path->startingNode).identifier.string.data = (UA_Byte *)pUVar8;
  if (pUVar8 == (UA_NodeStoreEntry *)0x0) {
    *(undefined4 *)&path->startingNode = 0x80030000;
    return;
  }
  local_b8 = session;
  pUVar9 = (UA_NodeStoreEntry *)malloc(0xf0);
  if (pUVar9 == (UA_NodeStoreEntry *)0x0) {
    *(undefined4 *)&path->startingNode = 0x80030000;
LAB_00122a81:
    free(pUVar8);
    return;
  }
  __ptr = (UA_NodeStoreEntry *)malloc(0xf0);
  pUVar2 = local_b8;
  if (__ptr == (UA_NodeStoreEntry *)0x0) {
    *(undefined4 *)&path->startingNode = 0x80030000;
    free(pUVar8);
    pUVar8 = pUVar9;
    goto LAB_00122a81;
  }
  UVar5 = UA_copy(local_b8,pUVar9,UA_TYPES + 0x10);
  *(UA_StatusCode *)&path->startingNode = UVar5;
  if (UVar5 != 0) {
    free((path->startingNode).identifier.string.data);
    free(pUVar9);
    pUVar8 = __ptr;
    goto LAB_00122a81;
  }
  if ((pUVar2->clientDescription).productUri.data == (UA_Byte *)0x0) {
    __assert_fail("path->relativePath.elementsSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x5ade,
                  "void walkBrowsePath(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *, size_t, UA_NodeId **, size_t *, size_t *, UA_NodeId **, size_t *, size_t *)"
                 );
  }
  local_78 = &(path->startingNode).identifier;
  sVar18 = (pUVar2->clientDescription).applicationName.locale.length;
  pUVar7 = (UA_Byte *)0x0;
  local_58 = 10;
  local_90 = (UA_UInt16 *)0x0;
  local_50 = 10;
  uVar21 = 1;
  uVar12 = 10;
  local_70 = path;
  do {
    uVar14 = uVar12;
    pUVar19 = (UA_NodeId *)(sVar18 + (long)pUVar7 * 0x38);
    local_b0 = (UA_NodeId *)0x0;
    local_c8 = 1;
    local_c0 = uVar21;
    local_98 = pUVar7;
    local_31 = UA_NodeId_isNull(pUVar19);
    pUVar15 = local_70;
    local_60 = __ptr;
    local_a0 = pUVar9;
    local_48 = pUVar19;
    if ((bool)local_31) {
      local_88 = (UA_NodeId *)0x0;
      local_80 = 1;
LAB_00122bbc:
      local_68 = 0;
      uVar21 = 0;
      uVar12 = local_50;
      do {
        ppUVar10 = findNode((UA_NodeStore *)reftypes[3].identifier.string.length,
                            (UA_NodeId *)(&pUVar9->orig + uVar21 * 3));
        pUVar19 = local_48;
        if (ppUVar10 == (UA_NodeStoreEntry **)0x0) {
          if ((int)local_98 == 0) {
            *(undefined4 *)&pUVar15->startingNode = 0x80340000;
          }
        }
        else {
          pUVar8 = *ppUVar10;
          if (((local_90 == (UA_UInt16 *)0x0) ||
              (((*local_90 == (pUVar8->node).browseName.namespaceIndex &&
                (*(size_t *)(local_90 + 4) == (pUVar8->node).browseName.name.length)) &&
               (iVar6 = bcmp(*(void **)(local_90 + 8),(pUVar8->node).browseName.name.data,
                             *(size_t *)(local_90 + 4)), pUVar19 = local_48, iVar6 == 0)))) &&
             (pUVar19 = local_48, (pUVar8->node).referencesSize != 0)) {
            UVar5 = *(UA_StatusCode *)&pUVar15->startingNode;
            uVar20 = 0;
            local_40 = pUVar8;
            do {
              if (UVar5 != 0) break;
              pUVar17 = (local_40->node).references;
              UVar5 = 0;
              if (pUVar17[uVar20].isInverse == (UA_Boolean)(char)pUVar19[1].namespaceIndex) {
                pUVar17 = pUVar17 + uVar20;
                local_50 = uVar12;
                n2 = local_88;
                sVar18 = local_80;
                pUVar15 = local_70;
                pUVar19 = local_48;
                if (local_31 == '\0') {
                  for (; UVar5 = 0, local_70 = pUVar15, local_50 = uVar12, local_48 = pUVar19,
                      sVar18 != 0; sVar18 = sVar18 - 1) {
                    UVar4 = UA_NodeId_equal(&pUVar17->referenceTypeId,n2);
                    if (UVar4) goto LAB_00122c85;
                    uVar12 = local_50;
                    n2 = n2 + 1;
                    pUVar15 = local_70;
                    pUVar19 = local_48;
                  }
                }
                else {
LAB_00122c85:
                  uVar12 = local_50;
                  uVar3 = local_58;
                  pUVar15 = local_70;
                  if ((pUVar17->targetId).serverIndex == 0) {
                    if (local_58 <= local_68) {
                      pUVar8 = (UA_NodeStoreEntry *)realloc(local_60,local_58 * 0x30);
                      if (pUVar8 == (UA_NodeStoreEntry *)0x0) goto LAB_00122d8c;
                      local_58 = uVar3 * 2;
                      local_60 = pUVar8;
                    }
                    uVar12 = local_68;
                    UVar5 = UA_copy(&pUVar17->targetId,&local_60->orig + local_68 * 3,
                                    UA_TYPES + 0x10);
                    *(UA_StatusCode *)&pUVar15->startingNode = UVar5;
                    local_68 = uVar12 + 1;
                    pUVar19 = local_48;
                    uVar12 = local_50;
                  }
                  else {
                    pUVar11 = (UA_Byte *)
                              realloc((local_70->startingNode).identifier.string.data,
                                      local_50 * 0x70);
                    if (pUVar11 == (UA_Byte *)0x0) {
LAB_00122d8c:
                      *(undefined4 *)&pUVar15->startingNode = 0x80030000;
                      pUVar19 = local_48;
                      UVar5 = 0x80030000;
                    }
                    else {
                      (pUVar15->startingNode).identifier.string.data = pUVar11;
                      UVar5 = UA_copy(&pUVar17->targetId,
                                      pUVar11 + (pUVar15->startingNode).identifier.string.length *
                                                0x38,UA_TYPES + 0x11);
                      *(UA_StatusCode *)&pUVar15->startingNode = UVar5;
                      *(int *)((pUVar15->startingNode).identifier.string.data +
                              (pUVar15->startingNode).identifier.string.length * 0x38 + 0x30) =
                           (int)local_98;
                      pUVar19 = local_48;
                      uVar12 = uVar12 * 2;
                    }
                  }
                }
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < (local_40->node).referencesSize);
          }
        }
        __ptr = local_a0;
        uVar21 = uVar21 + 1;
        pUVar9 = local_a0;
      } while (uVar21 != local_c0);
      local_50 = uVar12;
      if ((local_31 == '\0') && (*(char *)((long)&pUVar19[1].namespaceIndex + 1) == '\x01')) {
        UA_Array_delete(local_88,local_80,UA_TYPES + 0x10);
      }
    }
    else {
      if (*(char *)((long)&pUVar19[1].namespaceIndex + 1) == '\0') {
        local_80 = 1;
        local_b0 = pUVar19;
        local_88 = pUVar19;
        goto LAB_00122bbc;
      }
      ns = *(UA_NodeStore **)&reftypes[3].identifier;
      ppUVar10 = findNode(ns,pUVar19);
      if (((ppUVar10 != (UA_NodeStoreEntry **)0x0) &&
          (((*ppUVar10)->node).nodeClass == UA_NODECLASS_REFERENCETYPE)) &&
         (UVar5 = getTypeHierarchy(ns,&(*ppUVar10)->node,false,&local_b0,&local_c8), UVar5 == 0)) {
        local_80 = local_c8;
        local_88 = local_b0;
        goto LAB_00122bbc;
      }
      local_68 = 0;
      __ptr = pUVar9;
    }
    uVar12 = local_58;
    local_40 = local_60;
    uVar21 = local_c0;
    pUVar8 = __ptr;
    do {
      deleteMembers_noInit(pUVar8,UA_TYPES + 0x10);
      pUVar9 = local_40;
      uVar20 = local_68;
      pUVar15 = local_70;
      pUVar8->orig = (UA_NodeStoreEntry *)0x0;
      (pUVar8->node).nodeId.namespaceIndex = 0;
      *(undefined2 *)&(pUVar8->node).nodeId.field_0x2 = 0;
      (pUVar8->node).nodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
      (pUVar8->node).nodeId.identifier.string.length = 0;
      pUVar8 = (UA_NodeStoreEntry *)((long)&(pUVar8->node).nodeId.identifier + 8);
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
    pUVar8 = local_40;
    if (local_68 == 0) goto LAB_00123019;
    if (*(int *)&local_70->startingNode != 0) {
      __assert_fail("*nextCount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x5aed,
                    "void walkBrowsePath(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *, size_t, UA_NodeId **, size_t *, size_t *, UA_NodeId **, size_t *, size_t *)"
                   );
    }
    sVar18 = (local_b8->clientDescription).applicationName.locale.length;
    local_90 = (UA_UInt16 *)((long)pUVar7 * 0x38 + sVar18 + 0x20);
    pUVar7 = (UA_Byte *)(ulong)((int)local_98 + 1);
    uVar21 = local_68;
    local_58 = uVar14;
  } while (pUVar7 < (local_b8->clientDescription).productUri.data);
  uVar12 = (local_78->string).length + local_68;
  if (local_50 < uVar12) {
    pUVar7 = (UA_Byte *)realloc((local_70->startingNode).identifier.string.data,uVar12 * 0x38);
    if (pUVar7 == (UA_Byte *)0x0) {
      *(undefined4 *)&pUVar15->startingNode = 0x80030000;
      do {
        deleteMembers_noInit(pUVar9,UA_TYPES + 0x10);
        pUVar9->orig = (UA_NodeStoreEntry *)0x0;
        (pUVar9->node).nodeId.namespaceIndex = 0;
        *(undefined2 *)&(pUVar9->node).nodeId.field_0x2 = 0;
        (pUVar9->node).nodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
        (pUVar9->node).nodeId.identifier.string.length = 0;
        pUVar9 = (UA_NodeStoreEntry *)((long)&(pUVar9->node).nodeId.identifier + 8);
        uVar20 = uVar20 - 1;
        __ptr = local_40;
        pUVar8 = local_a0;
      } while (uVar20 != 0);
      goto LAB_00123019;
    }
    (pUVar15->startingNode).identifier.string.data = pUVar7;
  }
  do {
    ppUVar10 = findNode((UA_NodeStore *)reftypes[3].identifier.string.length,(UA_NodeId *)pUVar9);
    if ((((ppUVar10 == (UA_NodeStoreEntry **)0x0) ||
         (pUVar8 = *ppUVar10, *local_90 != (pUVar8->node).browseName.namespaceIndex)) ||
        (*(size_t *)(local_90 + 4) != (pUVar8->node).browseName.name.length)) ||
       (iVar6 = bcmp(*(void **)(local_90 + 8),(pUVar8->node).browseName.name.data,
                     *(size_t *)(local_90 + 4)), iVar6 != 0)) {
      deleteMembers_noInit(pUVar9,UA_TYPES + 0x10);
      pUVar9->orig = (UA_NodeStoreEntry *)0x0;
      (pUVar9->node).nodeId.namespaceIndex = 0;
      *(undefined2 *)&(pUVar9->node).nodeId.field_0x2 = 0;
      (pUVar9->node).nodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
      (pUVar9->node).nodeId.identifier.string.length = 0;
    }
    else {
      pUVar11 = (pUVar15->startingNode).identifier.string.data;
      lVar16 = (pUVar15->startingNode).identifier.string.length * 0x38;
      pUVar7 = pUVar11 + lVar16 + 0x20;
      pUVar7[0] = '\0';
      pUVar7[1] = '\0';
      pUVar7[2] = '\0';
      pUVar7[3] = '\0';
      pUVar7[4] = '\0';
      pUVar7[5] = '\0';
      pUVar7[6] = '\0';
      pUVar7[7] = '\0';
      pUVar7[8] = '\0';
      pUVar7[9] = '\0';
      pUVar7[10] = '\0';
      pUVar7[0xb] = '\0';
      pUVar7[0xc] = '\0';
      pUVar7[0xd] = '\0';
      pUVar7[0xe] = '\0';
      pUVar7[0xf] = '\0';
      pUVar7 = pUVar11 + lVar16 + 0x10;
      pUVar7[0] = '\0';
      pUVar7[1] = '\0';
      pUVar7[2] = '\0';
      pUVar7[3] = '\0';
      pUVar7[4] = '\0';
      pUVar7[5] = '\0';
      pUVar7[6] = '\0';
      pUVar7[7] = '\0';
      pUVar7[8] = '\0';
      pUVar7[9] = '\0';
      pUVar7[10] = '\0';
      pUVar7[0xb] = '\0';
      pUVar7[0xc] = '\0';
      pUVar7[0xd] = '\0';
      pUVar7[0xe] = '\0';
      pUVar7[0xf] = '\0';
      pUVar7 = pUVar11 + lVar16;
      pUVar7[0] = '\0';
      pUVar7[1] = '\0';
      pUVar7[2] = '\0';
      pUVar7[3] = '\0';
      pUVar7[4] = '\0';
      pUVar7[5] = '\0';
      pUVar7[6] = '\0';
      pUVar7[7] = '\0';
      pUVar7[8] = '\0';
      pUVar7[9] = '\0';
      pUVar7[10] = '\0';
      pUVar7[0xb] = '\0';
      pUVar7[0xc] = '\0';
      pUVar7[0xd] = '\0';
      pUVar7[0xe] = '\0';
      pUVar7[0xf] = '\0';
      pUVar11 = pUVar11 + lVar16 + 0x30;
      pUVar11[0] = '\0';
      pUVar11[1] = '\0';
      pUVar11[2] = '\0';
      pUVar11[3] = '\0';
      pUVar11[4] = '\0';
      pUVar11[5] = '\0';
      pUVar11[6] = '\0';
      pUVar11[7] = '\0';
      pUVar7 = (pUVar15->startingNode).identifier.string.data;
      lVar16 = (pUVar15->startingNode).identifier.string.length * 0x38;
      *(size_t *)(pUVar7 + lVar16 + 0x10) = (pUVar9->node).nodeId.identifier.string.length;
      uVar1 = *(undefined8 *)&(pUVar9->node).nodeId;
      pUVar7 = pUVar7 + lVar16;
      *(UA_NodeStoreEntry **)pUVar7 = pUVar9->orig;
      *(undefined8 *)(pUVar7 + 8) = uVar1;
      sVar18 = (pUVar15->startingNode).identifier.string.length;
      pUVar7 = (pUVar15->startingNode).identifier.string.data + sVar18 * 0x38 + 0x30;
      pUVar7[0] = 0xff;
      pUVar7[1] = 0xff;
      pUVar7[2] = 0xff;
      pUVar7[3] = 0xff;
      (pUVar15->startingNode).identifier.string.length = sVar18 + 1;
    }
    pUVar9 = (UA_NodeStoreEntry *)((long)&(pUVar9->node).nodeId.identifier + 8);
    local_68 = local_68 - 1;
  } while (local_68 != 0);
  local_68 = 0;
  __ptr = local_40;
  pUVar8 = local_a0;
LAB_00123019:
  if (((local_78->string).length == 0) && (*(int *)&pUVar15->startingNode == 0)) {
    *(undefined4 *)&pUVar15->startingNode = 0x806f0000;
  }
  free(__ptr);
  free(pUVar8);
  if (*(int *)&pUVar15->startingNode != 0) {
    if ((local_78->string).length != 0) {
      lVar16 = 0;
      uVar12 = 0;
      do {
        pUVar11 = (pUVar15->startingNode).identifier.string.data;
        deleteMembers_noInit(pUVar11 + lVar16,UA_TYPES + 0x1a);
        pUVar7 = pUVar11 + lVar16 + 0x20;
        pUVar7[0] = '\0';
        pUVar7[1] = '\0';
        pUVar7[2] = '\0';
        pUVar7[3] = '\0';
        pUVar7[4] = '\0';
        pUVar7[5] = '\0';
        pUVar7[6] = '\0';
        pUVar7[7] = '\0';
        pUVar7[8] = '\0';
        pUVar7[9] = '\0';
        pUVar7[10] = '\0';
        pUVar7[0xb] = '\0';
        pUVar7[0xc] = '\0';
        pUVar7[0xd] = '\0';
        pUVar7[0xe] = '\0';
        pUVar7[0xf] = '\0';
        pUVar7 = pUVar11 + lVar16 + 0x10;
        pUVar7[0] = '\0';
        pUVar7[1] = '\0';
        pUVar7[2] = '\0';
        pUVar7[3] = '\0';
        pUVar7[4] = '\0';
        pUVar7[5] = '\0';
        pUVar7[6] = '\0';
        pUVar7[7] = '\0';
        pUVar7[8] = '\0';
        pUVar7[9] = '\0';
        pUVar7[10] = '\0';
        pUVar7[0xb] = '\0';
        pUVar7[0xc] = '\0';
        pUVar7[0xd] = '\0';
        pUVar7[0xe] = '\0';
        pUVar7[0xf] = '\0';
        pUVar7 = pUVar11 + lVar16;
        pUVar7[0] = '\0';
        pUVar7[1] = '\0';
        pUVar7[2] = '\0';
        pUVar7[3] = '\0';
        pUVar7[4] = '\0';
        pUVar7[5] = '\0';
        pUVar7[6] = '\0';
        pUVar7[7] = '\0';
        pUVar7[8] = '\0';
        pUVar7[9] = '\0';
        pUVar7[10] = '\0';
        pUVar7[0xb] = '\0';
        pUVar7[0xc] = '\0';
        pUVar7[0xd] = '\0';
        pUVar7[0xe] = '\0';
        pUVar7[0xf] = '\0';
        pUVar11 = pUVar11 + lVar16 + 0x30;
        pUVar11[0] = '\0';
        pUVar11[1] = '\0';
        pUVar11[2] = '\0';
        pUVar11[3] = '\0';
        pUVar11[4] = '\0';
        pUVar11[5] = '\0';
        pUVar11[6] = '\0';
        pUVar11[7] = '\0';
        uVar12 = uVar12 + 1;
        lVar16 = lVar16 + 0x38;
      } while (uVar12 < (pUVar15->startingNode).identifier.string.length);
    }
    free((pUVar15->startingNode).identifier.string.data);
    (local_78->string).length = 0;
    (local_78->string).data = (UA_Byte *)0x0;
  }
  return;
}

Assistant:

static void
translateBrowsePathToNodeIds(UA_Server *server, UA_Session *session,
                             const UA_BrowsePath *path, UA_BrowsePathResult *result) {
    if(path->relativePath.elementsSize <= 0) {
        result->statusCode = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }
        
    /* RelativePath elements must not have an empty targetName */
    for(size_t i = 0; i < path->relativePath.elementsSize; ++i) {
        if(UA_QualifiedName_isNull(&path->relativePath.elements[i].targetName)) {
            result->statusCode = UA_STATUSCODE_BADBROWSENAMEINVALID;
            return;
        }
    }

    /* Allocate memory for the targets */
    size_t targetsSize = 10; /* When to realloc; the member count is stored in
                              * result->targetsSize */
    result->targets = (UA_BrowsePathTarget*)UA_malloc(sizeof(UA_BrowsePathTarget) * targetsSize);
    if(!result->targets) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    /* Allocate memory for two temporary arrays. One with the results for the
     * previous depth of the path. The other for the new results at the current
     * depth. The two arrays alternate as we descend down the tree. */
    size_t currentSize = 10; /* When to realloc */
    size_t currentCount = 0; /* Current elements */
    UA_NodeId *current = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * currentSize);
    if(!current) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        return;
    }
    size_t nextSize = 10; /* When to realloc */
    size_t nextCount = 0; /* Current elements */
    UA_NodeId *next = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * nextSize);
    if(!next) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        UA_free(current);
        return;
    }

    /* Copy the starting node into current */
    result->statusCode = UA_NodeId_copy(&path->startingNode, &current[0]);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_free(result->targets);
        UA_free(current);
        UA_free(next);
        return;
    }
    currentCount = 1;

    /* Walk the path elements */
    walkBrowsePath(server, session, path, result, targetsSize,
                   &current, &currentSize, &currentCount,
                   &next, &nextSize, &nextCount);

    UA_assert(currentCount == 0);
    UA_assert(nextCount == 0);

    /* No results => BadNoMatch status code */
    if(result->targetsSize == 0 && result->statusCode == UA_STATUSCODE_GOOD)
        result->statusCode = UA_STATUSCODE_BADNOMATCH;

    /* Clean up the temporary arrays and the targets */
    UA_free(current);
    UA_free(next);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        for(size_t i = 0; i < result->targetsSize; ++i)
            UA_BrowsePathTarget_deleteMembers(&result->targets[i]);
        UA_free(result->targets);
        result->targets = NULL;
        result->targetsSize = 0;
    }
}